

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CordRepBtree * absl::cord_internal::CordRepBtree::PrependSlow(CordRepBtree *tree,CordRep *rep)

{
  CordRepBtree *pCVar1;
  FunctionRef<void_(absl::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)> consume_fn;
  anon_class_8_1_8992209c consume;
  CordRepBtree *local_18;
  undefined1 *local_10;
  
  local_10 = (undefined1 *)&local_18;
  local_18 = tree;
  if (rep->tag == '\x03') {
    pCVar1 = MergeTrees((CordRepBtree *)rep,tree);
    return pCVar1;
  }
  consume_fn.invoker_ =
       (Invoker<void,_absl::cord_internal::CordRep_*,_unsigned_long,_unsigned_long>)rep;
  consume_fn.ptr_.fun =
       functional_internal::
       InvokeObject<absl::cord_internal::CordRepBtree::PrependSlow(absl::cord_internal::CordRepBtree*,absl::cord_internal::CordRep*)::__0,void,absl::cord_internal::CordRep*,unsigned_long,unsigned_long>
  ;
  ReverseConsume((cord_internal *)rep,(CordRep *)&local_10,consume_fn);
  return local_18;
}

Assistant:

CordRepBtree* CordRepBtree::PrependSlow(CordRepBtree* tree, CordRep* rep) {
  if (ABSL_PREDICT_TRUE(rep->IsBtree())) {
    return MergeTrees(rep->btree(), tree);
  }
  auto consume = [&tree](CordRep* r, size_t offset, size_t length) {
    r = MakeSubstring(r, offset, length);
    tree = CordRepBtree::AddCordRep<kFront>(tree, r);
  };
  ReverseConsume(rep, consume);
  return tree;
}